

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  u16 uVar1;
  uint uVar2;
  uint uVar3;
  sqlite3_io_methods *psVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint *__s;
  ht_slot *aTmp;
  long lVar13;
  long lVar14;
  ulong uVar15;
  short sVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint *puVar20;
  u64 n;
  ushort *puVar21;
  uint uVar22;
  long *plVar23;
  u32 *aContent;
  uint uVar24;
  undefined1 auVar25 [16];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar48;
  undefined1 auVar46 [16];
  int iVar49;
  undefined1 auVar47 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar52 [16];
  i64 nReq;
  int isChanged;
  int nList;
  u32 *aPgno;
  _func_int_void_ptr *local_190;
  uint local_17c;
  uint local_178;
  int local_174;
  ulong local_170;
  u32 *local_168;
  ht_slot *local_160;
  int local_154;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  Wal *local_138;
  uint *local_130;
  sqlite3 *local_128;
  long local_120;
  ulong local_118;
  ulong local_110;
  undefined8 local_108;
  long local_100 [26];
  long lVar28;
  
  local_154 = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  if ((pWal->exclusiveMode == '\0') &&
     (iVar11 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,10), iVar11 != 0)) {
    return iVar11;
  }
  pWal->ckptLock = '\x01';
  local_190 = xBusy;
  local_174 = sync_flags;
  local_128 = db;
  if (eMode != 0) {
    do {
      iVar11 = eMode;
      if (pWal->exclusiveMode != '\0') {
LAB_00126aa2:
        pWal->writeLock = '\x01';
        goto LAB_00126abd;
      }
      iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
      if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar10 != 5)) {
        if (iVar10 != 5) {
          if (iVar10 == 0) goto LAB_00126aa2;
          goto LAB_00126aec;
        }
        break;
      }
      iVar11 = (*xBusy)(pBusyArg);
    } while (iVar11 != 0);
    local_190 = (_func_int_void_ptr *)0x0;
  }
  iVar11 = 0;
LAB_00126abd:
  iVar10 = walIndexReadHdr(pWal,&local_154);
  if (local_154 != 0) {
    psVar4 = pWal->pDbFd->pMethods;
    if (2 < psVar4->iVersion) {
      (*psVar4->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
    }
  }
LAB_00126aec:
  if (iVar10 != 0) goto LAB_001273bb;
  uVar24 = (pWal->hdr).mxFrame;
  uVar1 = (pWal->hdr).szPage;
  uVar18 = CONCAT22(uVar1,uVar1) & 0x1fe00;
  if ((uVar24 != 0) && (uVar18 != nBuf)) {
    iVar10 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xe13b,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    goto LAB_001273bb;
  }
  local_168 = *pWal->apWiData;
  if (uVar24 <= local_168[0x18]) {
    __s = (uint *)0x0;
    iVar10 = 0;
    goto LAB_00126c0d;
  }
  local_170 = (ulong)uVar24;
  iVar12 = sqlite3_initialize();
  iVar10 = 7;
  if (iVar12 != 0) goto LAB_001273bb;
  uVar24 = (uint)((ulong)((int)local_170 + 0x1000) + 0xffffffff021 >> 0xc);
  n = (u64)(int)(uVar24 * 0x20 + (int)local_170 * 2 + 0x28);
  local_178 = uVar18;
  __s = (uint *)sqlite3Malloc(n);
  if (__s == (uint *)0x0) goto LAB_001273bb;
  aTmp = (ht_slot *)0x0;
  memset(__s,0,n);
  __s[1] = uVar24 + 1;
  iVar10 = sqlite3_initialize();
  if (iVar10 == 0) {
    uVar18 = 0x1000;
    if ((uint)local_170 < 0x1000) {
      uVar18 = (uint)local_170;
    }
    aTmp = (ht_slot *)sqlite3Malloc((ulong)(uVar18 * 2));
    local_138 = pWal;
    if ((aTmp == (ht_slot *)0x0) || ((int)uVar24 < 0)) {
      sqlite3_free(aTmp);
      if (aTmp == (ht_slot *)0x0) {
        iVar10 = 7;
        goto LAB_0012737d;
      }
    }
    else {
      local_130 = __s + 2;
      local_150 = (ulong)(uVar24 & 0x7fffffff);
      local_120 = (long)__s + 0x16;
      uVar17 = 0;
      do {
        pWal = local_138;
        iVar10 = walIndexPage(local_138,(int)uVar17,(u32 **)&local_108);
        auVar8 = _DAT_00180e30;
        if (iVar10 != 0) goto LAB_00126bf8;
        lVar13 = 0;
        if (uVar17 == 0) {
          lVar13 = 0x88;
        }
        uVar24 = (int)uVar17 * 0x1000 - 0x22;
        if (uVar17 == 0) {
          uVar24 = 0;
        }
        local_118 = (ulong)uVar24;
        aContent = (u32 *)(CONCAT44(local_108._4_4_,(u32)local_108) + lVar13);
        uVar24 = (int)local_170 - uVar24;
        if (uVar17 != local_150) {
          uVar24 = 0x4000U - (int)lVar13 >> 2;
        }
        local_148 = (ulong)uVar24;
        lVar13 = (long)local_130 + local_118 * 2 + (long)(int)__s[1] * 0x20;
        local_110 = uVar17;
        if ((int)uVar24 < 1) {
          local_17c = 0;
          local_160 = (ht_slot *)0x0;
          memset(&local_108,0,0xd0);
          uVar24 = 1;
LAB_0012712b:
          uVar15 = (ulong)uVar24;
          plVar23 = local_100 + uVar15 * 2;
          uVar17 = local_148;
          do {
            if (((uint)uVar17 >> ((uint)uVar15 & 0x1f) & 1) != 0) {
              walMerge(aContent,(ht_slot *)*plVar23,(int)plVar23[-1],&local_160,(int *)&local_17c,
                       aTmp);
              uVar17 = local_148;
            }
            uVar15 = uVar15 + 1;
            plVar23 = plVar23 + 2;
          } while ((int)uVar15 != 0xd);
        }
        else {
          local_140 = (ulong)uVar24;
          lVar14 = local_140 - 1;
          auVar25._8_4_ = (int)lVar14;
          auVar25._0_8_ = lVar14;
          auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = (long)(int)__s[1] * 0x20 + local_118 * 2 + local_120;
          auVar25 = auVar25 ^ _DAT_00180e30;
          uVar17 = 0;
          auVar27 = _DAT_00180e20;
          auVar29 = _DAT_00180e10;
          auVar30 = _DAT_00180e00;
          auVar31 = _DAT_00180df0;
          do {
            auVar32 = auVar27 ^ auVar8;
            iVar10 = auVar25._0_4_;
            iVar45 = -(uint)(iVar10 < auVar32._0_4_);
            iVar12 = auVar25._4_4_;
            auVar33._4_4_ = -(uint)(iVar12 < auVar32._4_4_);
            iVar49 = auVar25._8_4_;
            iVar48 = -(uint)(iVar49 < auVar32._8_4_);
            iVar26 = auVar25._12_4_;
            auVar33._12_4_ = -(uint)(iVar26 < auVar32._12_4_);
            auVar42._4_4_ = iVar45;
            auVar42._0_4_ = iVar45;
            auVar42._8_4_ = iVar48;
            auVar42._12_4_ = iVar48;
            auVar50 = pshuflw(in_XMM8,auVar42,0xe8);
            auVar35._4_4_ = -(uint)(auVar32._4_4_ == iVar12);
            auVar35._12_4_ = -(uint)(auVar32._12_4_ == iVar26);
            auVar35._0_4_ = auVar35._4_4_;
            auVar35._8_4_ = auVar35._12_4_;
            auVar52 = pshuflw(in_XMM9,auVar35,0xe8);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar51 = pshuflw(auVar50,auVar33,0xe8);
            auVar32._8_4_ = 0xffffffff;
            auVar32._0_8_ = 0xffffffffffffffff;
            auVar32._12_4_ = 0xffffffff;
            auVar32 = (auVar51 | auVar52 & auVar50) ^ auVar32;
            auVar32 = packssdw(auVar32,auVar32);
            sVar16 = (short)uVar17;
            if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + -0xe + uVar17 * 2) = sVar16;
            }
            auVar33 = auVar35 & auVar42 | auVar33;
            auVar32 = packssdw(auVar33,auVar33);
            auVar51._8_4_ = 0xffffffff;
            auVar51._0_8_ = 0xffffffffffffffff;
            auVar51._12_4_ = 0xffffffff;
            auVar32 = packssdw(auVar32 ^ auVar51,auVar32 ^ auVar51);
            if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
              *(short *)(lVar14 + -0xc + uVar17 * 2) = sVar16 + 1;
            }
            auVar32 = auVar29 ^ auVar8;
            iVar45 = -(uint)(iVar10 < auVar32._0_4_);
            auVar46._4_4_ = -(uint)(iVar12 < auVar32._4_4_);
            iVar48 = -(uint)(iVar49 < auVar32._8_4_);
            auVar46._12_4_ = -(uint)(iVar26 < auVar32._12_4_);
            auVar34._4_4_ = iVar45;
            auVar34._0_4_ = iVar45;
            auVar34._8_4_ = iVar48;
            auVar34._12_4_ = iVar48;
            auVar41._4_4_ = -(uint)(auVar32._4_4_ == iVar12);
            auVar41._12_4_ = -(uint)(auVar32._12_4_ == iVar26);
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar32 = auVar41 & auVar34 | auVar46;
            auVar32 = packssdw(auVar32,auVar32);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar32 = packssdw(auVar32 ^ auVar6,auVar32 ^ auVar6);
            if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + -10 + uVar17 * 2) = sVar16 + 2;
            }
            auVar35 = pshufhw(auVar34,auVar34,0x84);
            auVar42 = pshufhw(auVar41,auVar41,0x84);
            auVar33 = pshufhw(auVar35,auVar46,0x84);
            auVar36._8_4_ = 0xffffffff;
            auVar36._0_8_ = 0xffffffffffffffff;
            auVar36._12_4_ = 0xffffffff;
            auVar36 = (auVar33 | auVar42 & auVar35) ^ auVar36;
            auVar35 = packssdw(auVar36,auVar36);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + -8 + uVar17 * 2) = sVar16 + 3;
            }
            auVar35 = auVar30 ^ auVar8;
            iVar45 = -(uint)(iVar10 < auVar35._0_4_);
            auVar38._4_4_ = -(uint)(iVar12 < auVar35._4_4_);
            iVar48 = -(uint)(iVar49 < auVar35._8_4_);
            auVar38._12_4_ = -(uint)(iVar26 < auVar35._12_4_);
            auVar43._4_4_ = iVar45;
            auVar43._0_4_ = iVar45;
            auVar43._8_4_ = iVar48;
            auVar43._12_4_ = iVar48;
            auVar32 = pshuflw(auVar32,auVar43,0xe8);
            auVar37._4_4_ = -(uint)(auVar35._4_4_ == iVar12);
            auVar37._12_4_ = -(uint)(auVar35._12_4_ == iVar26);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            in_XMM9 = pshuflw(auVar52 & auVar50,auVar37,0xe8);
            in_XMM9 = in_XMM9 & auVar32;
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar32 = pshuflw(auVar32,auVar38,0xe8);
            auVar50._8_4_ = 0xffffffff;
            auVar50._0_8_ = 0xffffffffffffffff;
            auVar50._12_4_ = 0xffffffff;
            auVar50 = (auVar32 | in_XMM9) ^ auVar50;
            auVar32 = packssdw(auVar50,auVar50);
            if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + -6 + uVar17 * 2) = sVar16 + 4;
            }
            auVar38 = auVar37 & auVar43 | auVar38;
            auVar32 = packssdw(auVar38,auVar38);
            auVar52._8_4_ = 0xffffffff;
            auVar52._0_8_ = 0xffffffffffffffff;
            auVar52._12_4_ = 0xffffffff;
            auVar32 = packssdw(auVar32 ^ auVar52,auVar32 ^ auVar52);
            if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + -4 + uVar17 * 2) = sVar16 + 5;
            }
            auVar32 = auVar31 ^ auVar8;
            iVar10 = -(uint)(iVar10 < auVar32._0_4_);
            auVar47._4_4_ = -(uint)(iVar12 < auVar32._4_4_);
            iVar49 = -(uint)(iVar49 < auVar32._8_4_);
            auVar47._12_4_ = -(uint)(iVar26 < auVar32._12_4_);
            auVar39._4_4_ = iVar10;
            auVar39._0_4_ = iVar10;
            auVar39._8_4_ = iVar49;
            auVar39._12_4_ = iVar49;
            auVar44._4_4_ = -(uint)(auVar32._4_4_ == iVar12);
            auVar44._12_4_ = -(uint)(auVar32._12_4_ == iVar26);
            auVar44._0_4_ = auVar44._4_4_;
            auVar44._8_4_ = auVar44._12_4_;
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar32 = auVar44 & auVar39 | auVar47;
            auVar32 = packssdw(auVar32,auVar32);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar32 ^ auVar7,auVar32 ^ auVar7);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + -2 + uVar17 * 2) = sVar16 + 6;
            }
            auVar32 = pshufhw(auVar39,auVar39,0x84);
            auVar33 = pshufhw(auVar44,auVar44,0x84);
            auVar35 = pshufhw(auVar32,auVar47,0x84);
            auVar40._8_4_ = 0xffffffff;
            auVar40._0_8_ = 0xffffffffffffffff;
            auVar40._12_4_ = 0xffffffff;
            auVar40 = (auVar35 | auVar33 & auVar32) ^ auVar40;
            auVar32 = packssdw(auVar40,auVar40);
            if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + uVar17 * 2) = sVar16 + 7;
            }
            uVar17 = uVar17 + 8;
            lVar28 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 8;
            auVar27._8_8_ = lVar28 + 8;
            lVar28 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 8;
            auVar29._8_8_ = lVar28 + 8;
            lVar28 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 8;
            auVar30._8_8_ = lVar28 + 8;
            lVar28 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 8;
            auVar31._8_8_ = lVar28 + 8;
          } while ((uVar24 + 7 & 0xfffffff8) != uVar17);
          memset(&local_108,0,0xd0);
          uVar17 = 0;
          do {
            local_17c = 1;
            local_160 = (ht_slot *)(lVar13 + uVar17 * 2);
            uVar15 = 0;
            if ((uVar17 & 1) != 0) {
              do {
                walMerge(aContent,(ht_slot *)local_100[uVar15 * 2],*(int *)(&local_108 + uVar15 * 2)
                         ,&local_160,(int *)&local_17c,aTmp);
                uVar24 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar24;
              } while (((uint)uVar17 >> (uVar24 & 0x1f) & 1) != 0);
            }
            local_100[uVar15 * 2] = (long)local_160;
            *(uint *)(&local_108 + uVar15 * 2) = local_17c;
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_140);
          uVar24 = (int)uVar15 + 1;
          if (uVar24 < 0xd) goto LAB_0012712b;
        }
        pWal = local_138;
        local_130[local_110 * 8 + 7] = (int)local_118 + 1;
        local_130[local_110 * 8 + 6] = local_17c;
        *(long *)(local_130 + local_110 * 8 + 2) = lVar13;
        *(u32 **)(local_130 + local_110 * 8 + 4) = aContent;
        uVar17 = local_110 + 1;
      } while (local_110 != local_150);
      sqlite3_free(aTmp);
    }
    uVar24 = (pWal->hdr).mxFrame;
    local_140 = (ulong)(pWal->hdr).nPage;
    iVar10 = 0;
    lVar13 = 1;
    do {
      uVar18 = local_168[lVar13 + 0x19];
      if (uVar18 < uVar24) {
        iVar12 = (int)lVar13 + 3;
        do {
          if (pWal->exclusiveMode != '\0') {
LAB_00127268:
            uVar18 = 0xffffffff;
            if (lVar13 == 1) {
              uVar18 = uVar24;
            }
            local_168[lVar13 + 0x19] = uVar18;
            iVar10 = 0;
            if (pWal->exclusiveMode == '\0') {
              (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar12,1,9);
            }
            goto LAB_001272b1;
          }
          iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar12,1,10);
          if ((local_190 == (_func_int_void_ptr *)0x0) || (iVar10 != 5)) {
            if (iVar10 == 5) goto LAB_001272a2;
            if (iVar10 == 0) goto LAB_00127268;
            goto LAB_0012737d;
          }
          iVar10 = (*local_190)(pBusyArg);
        } while (iVar10 != 0);
        iVar10 = 5;
LAB_001272a2:
        local_190 = (_func_int_void_ptr *)0x0;
        uVar24 = uVar18;
      }
LAB_001272b1:
      lVar13 = lVar13 + 1;
    } while (lVar13 != 5);
    if (local_168[0x18] < uVar24) {
      do {
        if (pWal->exclusiveMode != '\0') {
LAB_00127452:
          local_148 = CONCAT44(local_148._4_4_,local_168[0x18]);
          local_168[0x20] = uVar24;
          if ((local_174 != 0) &&
             (iVar10 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,local_174), iVar10 != 0))
          goto LAB_001274ac;
          local_170 = (ulong)local_178;
          local_160 = (ht_slot *)(local_140 * local_170);
          iVar10 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,&local_108);
          if (iVar10 != 0) goto LAB_001274ac;
          if (CONCAT44(local_108._4_4_,(u32)local_108) < (long)local_160) {
            (*pWal->pDbFd->pMethods->xFileControl)(pWal->pDbFd,5,&local_160);
          }
          uVar18 = __s[1];
          if ((int)uVar18 < 1) goto LAB_00127655;
          local_150 = (ulong)(local_178 | 0x18);
          uVar22 = 0;
          goto LAB_00127532;
        }
        iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,10);
        if ((local_190 == (_func_int_void_ptr *)0x0) || (iVar10 != 5)) {
          if (iVar10 == 0) goto LAB_00127452;
          goto LAB_001274ce;
        }
        iVar12 = (*local_190)(pBusyArg);
        iVar10 = 0;
      } while (iVar12 != 0);
      goto LAB_00126c0d;
    }
    goto LAB_001274ce;
  }
  iVar10 = 7;
LAB_00126bf8:
  sqlite3_free(aTmp);
  goto LAB_0012737d;
  while( true ) {
    if (((((uint)local_148 < uVar22) && (uVar22 <= uVar24)) && (uVar19 <= (uint)local_140)) &&
       ((iVar10 = (*pWal->pWalFd->pMethods->xRead)
                            (pWal->pWalFd,zBuf,local_178,(uVar22 - 1) * local_150 + 0x38),
        iVar10 != 0 ||
        (iVar10 = (*pWal->pDbFd->pMethods->xWrite)(pWal->pDbFd,zBuf,uVar9,(uVar19 - 1) * local_170),
        iVar10 != 0)))) goto LAB_001274ac;
    uVar18 = __s[1];
    if ((int)uVar18 < 1) break;
LAB_00127532:
    uVar9 = local_178;
    uVar2 = *__s;
    uVar19 = 0xffffffff;
    uVar17 = (ulong)uVar18;
    do {
      uVar15 = uVar17 - 1;
      uVar18 = __s[uVar15 * 8 + 2];
      if ((int)uVar18 < (int)__s[uVar15 * 8 + 8]) {
        puVar20 = __s + uVar15 * 8 + 2;
        puVar21 = (ushort *)((long)(int)uVar18 * 2 + *(long *)(puVar20 + 2));
        do {
          uVar18 = uVar18 + 1;
          uVar3 = *(uint *)(*(long *)(puVar20 + 4) + (ulong)*puVar21 * 4);
          if (uVar2 < uVar3) {
            if (uVar3 < uVar19) {
              uVar22 = (uint)*puVar21 + puVar20[7];
              uVar19 = uVar3;
            }
            break;
          }
          *puVar20 = uVar18;
          puVar21 = puVar21 + 1;
        } while (uVar18 != __s[uVar15 * 8 + 8]);
      }
      bVar5 = 1 < (long)uVar17;
      uVar17 = uVar15;
    } while (bVar5);
    *__s = uVar19;
    if (uVar19 == 0xffffffff) goto LAB_0012765b;
    if ((local_128->u1).isInterrupted != 0) {
      iVar10 = (uint)(local_128->mallocFailed == '\0') * 2 + 7;
      goto LAB_001274ac;
    }
  }
LAB_00127655:
  *__s = 0xffffffff;
LAB_0012765b:
  if (uVar24 == (*pWal->apWiData)[4]) {
    iVar10 = (*pWal->pDbFd->pMethods->xTruncate)(pWal->pDbFd,local_170 * (pWal->hdr).nPage);
    if ((local_174 != 0) && (iVar10 == 0)) {
      iVar10 = (*local_138->pDbFd->pMethods->xSync)(local_138->pDbFd,local_174);
    }
    pWal = local_138;
    if (iVar10 == 0) goto LAB_001276ce;
  }
  else {
LAB_001276ce:
    local_168[0x18] = uVar24;
    iVar10 = 0;
  }
LAB_001274ac:
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,9);
  }
LAB_001274ce:
  if (iVar10 == 5) {
    iVar10 = 0;
  }
LAB_00126c0d:
  if ((((iVar11 != 0) && (iVar10 == 0)) && (iVar10 = 5, (pWal->hdr).mxFrame <= local_168[0x18])) &&
     (iVar10 = 0, 1 < iVar11)) {
    sqlite3_randomness(4,&local_108);
    do {
      if (pWal->exclusiveMode != '\0') {
LAB_0012732f:
        iVar10 = 0;
        if (iVar11 == 3) {
          walRestartHdr(pWal,(u32)local_108);
          iVar10 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
        }
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
        goto LAB_0012737d;
      }
      iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      if ((local_190 == (_func_int_void_ptr *)0x0) || (iVar10 != 5)) {
        if (iVar10 == 0) goto LAB_0012732f;
        goto LAB_0012737d;
      }
      iVar10 = (*local_190)(pBusyArg);
    } while (iVar10 != 0);
    iVar10 = 5;
  }
LAB_0012737d:
  sqlite3_free(__s);
  if ((iVar10 == 5) || (iVar10 == 0)) {
    if (pnLog != (int *)0x0) {
      *pnLog = (pWal->hdr).mxFrame;
    }
    if (pnCkpt != (int *)0x0) {
      *pnCkpt = (*pWal->apWiData)[0x18];
    }
  }
LAB_001273bb:
  if (local_154 != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,9);
  }
  iVar12 = 5;
  if (iVar10 != 0) {
    iVar12 = iVar10;
  }
  pWal->ckptLock = '\0';
  if (iVar11 == eMode) {
    iVar12 = iVar10;
  }
  return iVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive 
  ** "checkpoint" lock on the database file. */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  if( rc ){
    /* EVIDENCE-OF: R-10421-19736 If any other process is running a
    ** checkpoint operation at the same time, the lock cannot be obtained and
    ** SQLITE_BUSY is returned.
    ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
    ** it will not be invoked in this case.
    */
    testcase( rc==SQLITE_BUSY );
    testcase( xBusy!=0 );
    return rc;
  }
  pWal->ckptLock = 1;

  /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
  ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
  ** file.
  **
  ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
  ** immediately, and a busy-handler is configured, it is invoked and the
  ** writer lock retried until either the busy-handler returns 0 or the
  ** lock is successfully obtained.
  */
  if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_WRITE_LOCK, 1);
    if( rc==SQLITE_OK ){
      pWal->writeLock = 1;
    }else if( rc==SQLITE_BUSY ){
      eMode2 = SQLITE_CHECKPOINT_PASSIVE;
      xBusy2 = 0;
      rc = SQLITE_OK;
    }
  }

  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    rc = walIndexReadHdr(pWal, &isChanged);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was 
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
  pWal->ckptLock = 0;
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}